

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void proto2_unittest::TestParsingMergeLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  TestParsingMergeLite **v1;
  TestParsingMergeLite **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *this;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *other;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup> *this_00;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup> *other_00;
  uint32_t *puVar3;
  TestAllTypesLite *pTVar4;
  TestParsingMergeLite_OptionalGroup *pTVar5;
  anon_union_104_1_493b367e_for_TestParsingMergeLite_7 *this_01;
  TestParsingMergeLite *extendee;
  LogMessage local_e0;
  Voidify local_ca;
  byte local_c9;
  LogMessage local_c8;
  Voidify local_b2;
  byte local_b1;
  LogMessage local_b0;
  Voidify local_99;
  uint local_98;
  uint32_t cached_has_bits;
  LogMessage local_88;
  Voidify local_71;
  TestParsingMergeLite *local_70;
  Nullable<const_char_*> local_68;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestParsingMergeLite *from;
  TestParsingMergeLite *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_30;
  char *local_28;
  Nullable<const_char_*> local_20;
  void *local_18;
  Nullable<const_char_*> local_10;
  
  arena = (Arena *)from_msg;
  from = (TestParsingMergeLite *)to_msg;
  _this = (TestParsingMergeLite *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_70 = (TestParsingMergeLite *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestParsingMergeLite_const*>(&local_70);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestParsingMergeLite*>(&from);
  local_68 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestParsingMergeLite_const*,proto2_unittest::TestParsingMergeLite*>
                       (v1,v2,"&from != _this");
  if (local_68 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_68);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
               ,0x2294,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_71,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_88);
  }
  local_98 = 0;
  this = _internal_mutable_repeated_all_types(from);
  other = _internal_repeated_all_types((TestParsingMergeLite *)arena);
  google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::MergeFrom(this,other);
  this_00 = _internal_mutable_repeatedgroup(from);
  other_00 = _internal_repeatedgroup((TestParsingMergeLite *)arena);
  google::protobuf::RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup>::MergeFrom
            (this_00,other_00);
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).first_owner_,0);
  local_98 = *puVar3;
  if ((local_98 & 7) != 0) {
    if ((local_98 & 1) != 0) {
      local_b1 = 0;
      if ((arena->impl_).first_arena_.cleanup_list_.prefetch_ptr_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x229f,"from._impl_.required_all_types_ != nullptr");
        local_b1 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_99,pLVar2);
      }
      if ((local_b1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b0);
      }
      if ((from->field_0)._impl_.required_all_types_ == (TestAllTypesLite *)0x0) {
        local_28 = (arena->impl_).first_arena_.cleanup_list_.prefetch_ptr_;
        local_20 = absl_log_internal_check_op_result;
        pTVar4 = (TestAllTypesLite *)
                 google::protobuf::Arena::CopyConstruct<proto2_unittest::TestAllTypesLite>
                           ((Arena *)absl_log_internal_check_op_result,local_28);
        (from->field_0)._impl_.required_all_types_ = pTVar4;
      }
      else {
        TestAllTypesLite::MergeFrom
                  ((from->field_0)._impl_.required_all_types_,
                   (TestAllTypesLite *)(arena->impl_).first_arena_.cleanup_list_.prefetch_ptr_);
      }
    }
    if ((local_98 & 2) != 0) {
      local_c9 = 0;
      if ((arena->impl_).first_arena_.string_block_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x22a7,"from._impl_.optional_all_types_ != nullptr");
        local_c9 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_b2,pLVar2);
      }
      if ((local_c9 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_c8);
      }
      if ((from->field_0)._impl_.optional_all_types_ == (TestAllTypesLite *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_arena_.string_block_._M_b._M_p;
        local_30 = absl_log_internal_check_op_result;
        pTVar4 = (TestAllTypesLite *)
                 google::protobuf::Arena::CopyConstruct<proto2_unittest::TestAllTypesLite>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.optional_all_types_ = pTVar4;
      }
      else {
        TestAllTypesLite::MergeFrom
                  ((from->field_0)._impl_.optional_all_types_,
                   (TestAllTypesLite *)(arena->impl_).first_arena_.string_block_._M_b._M_p);
      }
    }
    if ((local_98 & 4) != 0) {
      if ((arena->impl_).first_arena_.string_block_unused_.super___atomic_base<unsigned_long>._M_i
          == 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x22af,"from._impl_.optionalgroup_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_ca,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_e0);
      }
      if ((from->field_0)._impl_.optionalgroup_ == (TestParsingMergeLite_OptionalGroup *)0x0) {
        local_18 = (void *)(arena->impl_).first_arena_.string_block_unused_.
                           super___atomic_base<unsigned_long>._M_i;
        local_10 = absl_log_internal_check_op_result;
        pTVar5 = (TestParsingMergeLite_OptionalGroup *)
                 google::protobuf::Arena::
                 CopyConstruct<proto2_unittest::TestParsingMergeLite_OptionalGroup>
                           ((Arena *)absl_log_internal_check_op_result,local_18);
        (from->field_0)._impl_.optionalgroup_ = pTVar5;
      }
      else {
        TestParsingMergeLite_OptionalGroup::MergeFrom
                  ((from->field_0)._impl_.optionalgroup_,
                   (TestParsingMergeLite_OptionalGroup *)
                   (arena->impl_).first_arena_.string_block_unused_.
                   super___atomic_base<unsigned_long>._M_i);
      }
    }
  }
  uVar1 = local_98;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  this_01 = &from->field_0;
  extendee = default_instance();
  google::protobuf::internal::ExtensionSet::MergeFrom
            (&(this_01->_impl_)._extensions_,&extendee->super_MessageLite,
             (ExtensionSet *)&(arena->impl_).field_0x10);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(from->super_MessageLite)._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestParsingMergeLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestParsingMergeLite*>(&to_msg);
  auto& from = static_cast<const TestParsingMergeLite&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestParsingMergeLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_all_types()->MergeFrom(
      from._internal_repeated_all_types());
  _this->_internal_mutable_repeatedgroup()->MergeFrom(
      from._internal_repeatedgroup());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.required_all_types_ != nullptr);
      if (_this->_impl_.required_all_types_ == nullptr) {
        _this->_impl_.required_all_types_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.required_all_types_);
      } else {
        _this->_impl_.required_all_types_->MergeFrom(*from._impl_.required_all_types_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.optional_all_types_ != nullptr);
      if (_this->_impl_.optional_all_types_ == nullptr) {
        _this->_impl_.optional_all_types_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_all_types_);
      } else {
        _this->_impl_.optional_all_types_->MergeFrom(*from._impl_.optional_all_types_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.optionalgroup_ != nullptr);
      if (_this->_impl_.optionalgroup_ == nullptr) {
        _this->_impl_.optionalgroup_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optionalgroup_);
      } else {
        _this->_impl_.optionalgroup_->MergeFrom(*from._impl_.optionalgroup_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}